

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void optimize(Module *module)

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  Stats stats;
  FuncAttr funcAttr;
  
  stats.module = module;
  std::operator<<((ostream *)&std::cerr,"Original:\n");
  printIRStats(&stats);
  funcAttr.globalVarUses._M_h._M_buckets = &funcAttr.globalVarUses._M_h._M_single_bucket;
  funcAttr.globalVarUses._M_h._M_bucket_count = 1;
  funcAttr.globalVarUses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  funcAttr.globalVarUses._M_h._M_element_count = 0;
  funcAttr.globalVarUses._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  funcAttr.globalVarUses._M_h._M_rehash_policy._M_next_resize = 0;
  funcAttr.globalVarUses._M_h._M_single_bucket = (__node_base_ptr)0x0;
  funcAttr.globalVarDefs._M_h._M_buckets = &funcAttr.globalVarDefs._M_h._M_single_bucket;
  funcAttr.globalVarDefs._M_h._M_bucket_count = 1;
  funcAttr.globalVarDefs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  funcAttr.globalVarDefs._M_h._M_element_count = 0;
  funcAttr.globalVarDefs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  funcAttr.globalVarDefs._M_h._M_rehash_policy._M_next_resize = 0;
  funcAttr.globalVarDefs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  funcAttr.pureFuncs._M_h._M_buckets = &funcAttr.pureFuncs._M_h._M_single_bucket;
  funcAttr.pureFuncs._M_h._M_bucket_count = 1;
  funcAttr.pureFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  funcAttr.pureFuncs._M_h._M_element_count = 0;
  funcAttr.pureFuncs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  funcAttr.pureFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  funcAttr.pureFuncs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  mocker::runOptPasses<mocker::SparseSimpleConstantPropagation>(module);
  mocker::runOptPasses<mocker::GlobalConstantInline>(module);
  mocker::FuncAttr::init(&funcAttr,(EVP_PKEY_CTX *)module);
  mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
  mocker::runOptPasses<mocker::FunctionInline>(module);
  mocker::runOptPasses<mocker::UnusedFunctionRemoval>(module);
  mocker::runOptPasses<mocker::FunctionInline>(module);
  mocker::runOptPasses<mocker::UnusedFunctionRemoval>(module);
  mocker::runOptPasses<mocker::FunctionInline>(module);
  mocker::runOptPasses<mocker::UnusedFunctionRemoval>(module);
  mocker::runOptPasses<mocker::PromoteGlobalVariables>(module);
  std::operator<<((ostream *)&std::cerr,"\nAfter inline and promotion of global variables:\n");
  printIRStats(&stats);
  mocker::runOptPasses<mocker::RewriteBranches>(module);
  mocker::runOptPasses<mocker::SimplifyPhiFunctions>(module);
  mocker::runOptPasses<mocker::MergeBlocks>(module);
  mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
  std::operator<<((ostream *)&std::cerr,"\nAfter pre-SSA optimization:\n");
  printIRStats(&stats);
  mocker::runOptPasses<mocker::SSAConstruction>(module);
  mocker::FuncAttr::init(&funcAttr,(EVP_PKEY_CTX *)module);
  mocker::runOptPasses<mocker::DeadCodeElimination,mocker::FuncAttr&>(module,&funcAttr);
  mocker::runOptPasses<mocker::RewriteBranches>(module);
  mocker::runOptPasses<mocker::SimplifyPhiFunctions>(module);
  mocker::runOptPasses<mocker::MergeBlocks>(module);
  mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
  runOptsUntilFixedPoint(module);
  mocker::FuncAttr::init(&funcAttr,(EVP_PKEY_CTX *)module);
  mocker::runOptPasses<mocker::LoopInvariantCodeMotion,mocker::FuncAttr&>(module,&funcAttr);
  runOptsUntilFixedPoint(module);
  std::operator<<((ostream *)&std::cerr,"\nBefore SSA destruction:\n");
  printIRStats(&stats);
  mocker::runOptPasses<mocker::SSADestruction>(module);
  sVar1 = mocker::ir::Stats::countInsts<mocker::ir::Phi>(&stats);
  if (sVar1 == 0) {
    std::operator<<((ostream *)&std::cerr,"\nAfter SSA destruction:\n");
    printIRStats(&stats);
    runOptsUntilFixedPoint(module);
    std::operator<<((ostream *)&std::cerr,"\nAfter optimization:\n");
    printIRStats(&stats);
    mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
    mocker::runOptPasses<mocker::SSAConstruction>(module);
    iVar2 = 3;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      mocker::runOptPasses<mocker::SimplifyPhiFunctions>(module);
      mocker::runOptPasses<mocker::MergeBlocks>(module);
      mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
      mocker::FuncAttr::init(&funcAttr,(EVP_PKEY_CTX *)module);
      mocker::runOptPasses<mocker::DeadCodeElimination,mocker::FuncAttr&>(module,&funcAttr);
      mocker::runOptPasses<mocker::RemoveUnreachableBlocks>(module);
    }
    mocker::runOptPasses<mocker::CodegenPreparation>(module);
    std::operator<<((ostream *)&std::cerr,"\nAfter SSA reconstruction:\n");
    printIRStats(&stats);
    mocker::FuncAttr::~FuncAttr(&funcAttr);
    return;
  }
  __assert_fail("stats.countInsts<ir::Phi>() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/main.cpp"
                ,0xa7,"void optimize(mocker::ir::Module &)");
}

Assistant:

void optimize(mocker::ir::Module &module) {
  // ATTENTION!
  // * Unreachable blocks should be removed as soon as possible since every
  //   pass that uses the dominator tree requires such blocks having been
  //   removed.

  using namespace mocker;

  mocker::ir::Stats stats(module);
  std::cerr << "Original:\n";
  printIRStats(stats);

  FuncAttr funcAttr;

  runOptPasses<SparseSimpleConstantPropagation>(module);
  runOptPasses<GlobalConstantInline>(module);

  funcAttr.init(module);
  runOptPasses<RemoveUnreachableBlocks>(module);
  runOptPasses<FunctionInline>(module);
  runOptPasses<UnusedFunctionRemoval>(module);
  runOptPasses<FunctionInline>(module);
  runOptPasses<UnusedFunctionRemoval>(module);
  runOptPasses<FunctionInline>(module);
  runOptPasses<UnusedFunctionRemoval>(module);

  runOptPasses<PromoteGlobalVariables>(module);

  std::cerr << "\nAfter inline and promotion of global variables:\n";
  printIRStats(stats);

  runOptPasses<RewriteBranches>(module);
  runOptPasses<SimplifyPhiFunctions>(module);
  runOptPasses<MergeBlocks>(module);
  runOptPasses<RemoveUnreachableBlocks>(module);

  std::cerr << "\nAfter pre-SSA optimization:\n";
  printIRStats(stats);

  runOptPasses<SSAConstruction>(module);
  funcAttr.init(module);
  runOptPasses<DeadCodeElimination>(module, funcAttr);

  runOptPasses<RewriteBranches>(module);
  runOptPasses<SimplifyPhiFunctions>(module);
  runOptPasses<MergeBlocks>(module);
  runOptPasses<RemoveUnreachableBlocks>(module);
  runOptsUntilFixedPoint(module);
  funcAttr.init(module);
  runOptPasses<LoopInvariantCodeMotion>(module, funcAttr);
  runOptsUntilFixedPoint(module);

  std::cerr << "\nBefore SSA destruction:\n";
  printIRStats(stats);
  runOptPasses<SSADestruction>(module);
  assert(stats.countInsts<ir::Phi>() == 0);

  std::cerr << "\nAfter SSA destruction:\n";
  printIRStats(stats);

  runOptsUntilFixedPoint(module);

  std::cerr << "\nAfter optimization:\n";
  printIRStats(stats);

  runOptPasses<RemoveUnreachableBlocks>(module);
  runOptPasses<SSAConstruction>(module);
  for (int i = 0; i < 3; ++i) {
    runOptPasses<SimplifyPhiFunctions>(module);
    runOptPasses<MergeBlocks>(module);
    runOptPasses<RemoveUnreachableBlocks>(module);
    funcAttr.init(module);
    runOptPasses<DeadCodeElimination>(module, funcAttr);
    runOptPasses<RemoveUnreachableBlocks>(module);
  }

  runOptPasses<CodegenPreparation>(module);

  std::cerr << "\nAfter SSA reconstruction:\n";
  printIRStats(stats);
}